

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderCustomData.cpp
# Opt level: O1

shared_ptr<Assimp::Blender::CustomDataLayer> __thiscall
Assimp::Blender::getCustomDataLayer
          (Blender *this,CustomData *customdata,CustomDataType cdtype,string *name)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int iVar2;
  undefined4 in_register_00000014;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  pointer psVar4;
  bool bVar5;
  shared_ptr<Assimp::Blender::CustomDataLayer> sVar6;
  
  _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                CONCAT44(in_register_00000014,cdtype);
  psVar4 = (customdata->layers).
           super_vector<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
           .
           super__Vector_base<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar5 = psVar4 == (customdata->layers).
                    super_vector<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
                    .
                    super__Vector_base<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (bVar5) {
LAB_004e0df5:
      *(undefined8 *)this = 0;
      *(undefined8 *)(this + 8) = 0;
LAB_004e0dfb:
      sVar6.super___shared_ptr<Assimp::Blender::CustomDataLayer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var3._M_pi;
      sVar6.super___shared_ptr<Assimp::Blender::CustomDataLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)this;
      return (shared_ptr<Assimp::Blender::CustomDataLayer>)
             sVar6.super___shared_ptr<Assimp::Blender::CustomDataLayer,_(__gnu_cxx::_Lock_policy)2>;
    }
    if ((((psVar4->super___shared_ptr<Assimp::Blender::CustomDataLayer,_(__gnu_cxx::_Lock_policy)2>)
         ._M_ptr)->type == cdtype) &&
       (iVar2 = ::std::__cxx11::string::compare((char *)name), _Var3._M_pi = extraout_RDX,
       iVar2 == 0)) {
      *(element_type **)this =
           (psVar4->super___shared_ptr<Assimp::Blender::CustomDataLayer,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
      p_Var1 = (psVar4->
               super___shared_ptr<Assimp::Blender::CustomDataLayer,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var1;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        }
      }
      if (!bVar5) goto LAB_004e0dfb;
      goto LAB_004e0df5;
    }
    psVar4 = psVar4 + 1;
    bVar5 = psVar4 == (customdata->layers).
                      super_vector<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
                      .
                      super__Vector_base<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
  } while( true );
}

Assistant:

std::shared_ptr<CustomDataLayer> getCustomDataLayer(const CustomData &customdata, const CustomDataType cdtype, const std::string &name) {
            for (auto it = customdata.layers.begin(); it != customdata.layers.end(); ++it) {
                if (it->get()->type == cdtype && name == it->get()->name) {
                    return *it;
                }
            }
            return nullptr;
        }